

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O2

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx2
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  void *pvVar14;
  size_t sVar15;
  size_t sVar16;
  undefined1 auVar17 [16];
  int *piVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined2 *puVar23;
  void *pvVar24;
  undefined2 *puVar25;
  long lVar26;
  long lVar27;
  uint *puVar28;
  undefined4 uVar29;
  long lVar30;
  int i;
  long lVar31;
  long lVar32;
  int k;
  void *pvVar33;
  ulong uVar34;
  undefined2 *puVar35;
  undefined1 local_a8 [64];
  size_t local_68;
  short asStack_5c [2];
  short tmp [6] [3];
  
  local_68 = 0;
  local_a8._0_8_ = (void *)0x0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_8_ = 0;
  local_a8._24_4_ = 0;
  local_a8._32_8_ = (Allocator *)0x0;
  local_a8._40_4_ = 0;
  local_a8._44_4_ = 0;
  local_a8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  uVar34 = 0;
  Mat::create((Mat *)local_a8,0x24,inch,outch,2,(Allocator *)0x0);
  uVar20 = 0;
  if (0 < inch) {
    uVar20 = (ulong)(uint)inch;
  }
  uVar21 = 0;
  if (0 < outch) {
    uVar21 = (ulong)(uint)outch;
  }
  for (; uVar34 != uVar21; uVar34 = uVar34 + 1) {
    iVar19 = inch * 9 * (int)uVar34;
    pvVar14 = kernel->data;
    pvVar33 = (void *)(local_a8._16_8_ * local_68 * uVar34 + local_a8._0_8_);
    for (uVar22 = 0; uVar22 != uVar20; uVar22 = uVar22 + 1) {
      lVar31 = uVar22 * 9;
      cVar1 = *(char *)((long)pvVar14 + lVar31 + iVar19);
      cVar2 = *(char *)((long)pvVar14 + lVar31 + (long)iVar19 + 1);
      cVar3 = *(char *)((long)pvVar14 + lVar31 + (long)iVar19 + 2);
      cVar4 = *(char *)((long)pvVar14 + lVar31 + (long)iVar19 + 3);
      cVar5 = *(char *)((long)pvVar14 + lVar31 + (long)iVar19 + 4);
      cVar6 = *(char *)((long)pvVar14 + lVar31 + (long)iVar19 + 5);
      cVar7 = *(char *)((long)pvVar14 + lVar31 + (long)iVar19 + 6);
      cVar8 = *(char *)((long)pvVar14 + lVar31 + (long)iVar19 + 7);
      cVar9 = *(char *)((long)pvVar14 + lVar31 + (long)iVar19 + 8);
      for (lVar31 = 4; lVar31 != 0x28; lVar31 = lVar31 + 6) {
        sVar10 = *(short *)(&UNK_004f2aec + lVar31);
        sVar11 = *(short *)(&UNK_004f2aee + lVar31);
        sVar12 = *(short *)((long)&DAT_004f2af0 + lVar31);
        *(short *)((long)asStack_5c + lVar31) = sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1;
        *(short *)((long)asStack_5c + lVar31 + 2) = sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4
        ;
        *(short *)((long)tmp[0] + lVar31) = sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
      }
      pvVar24 = pvVar33;
      for (lVar31 = 0; lVar31 != 6; lVar31 = lVar31 + 1) {
        sVar10 = tmp[lVar31][0];
        uVar13 = *(uint *)(tmp[lVar31] + 1);
        puVar28 = &DAT_004f2af2;
        for (lVar32 = 0; lVar32 != 6; lVar32 = lVar32 + 1) {
          auVar17 = vpmullw_avx(ZEXT416(*puVar28),ZEXT416(uVar13));
          uVar29 = vpextrw_avx(auVar17,1);
          *(short *)((long)pvVar24 + lVar32 * 2) =
               (short)uVar29 + auVar17._0_2_ + *(short *)((long)puVar28 + -2) * sVar10;
          puVar28 = (uint *)((long)puVar28 + 6);
        }
        pvVar24 = (void *)((long)pvVar24 + 0xc);
      }
      pvVar33 = (void *)((long)pvVar33 + (long)(int)local_a8._44_4_ * local_a8._16_8_);
    }
  }
  Mat::create(kernel_tm,inch / 8,0x24,outch / 4,0x40,0x20,(Allocator *)0x0);
  iVar19 = kernel_tm->w;
  pvVar14 = kernel_tm->data;
  sVar15 = kernel_tm->elemsize;
  sVar16 = kernel_tm->cstep;
  for (uVar20 = 0; (long)(uVar20 | 3) < (long)outch; uVar20 = uVar20 + 4) {
    lVar31 = 0;
    for (lVar32 = 0; lVar32 != 0x24; lVar32 = lVar32 + 1) {
      lVar27 = (long)pvVar14 + (long)iVar19 * sVar15 * lVar32 + (uVar20 >> 2) * sVar16 * sVar15;
      puVar23 = (undefined2 *)(local_68 * local_a8._16_8_ * uVar20 + lVar31 + local_a8._0_8_);
      for (uVar34 = 0; (long)(uVar34 | 7) < (long)inch; uVar34 = uVar34 + 8) {
        puVar25 = puVar23;
        for (lVar26 = 0; lVar26 != 4; lVar26 = lVar26 + 1) {
          puVar35 = puVar25;
          for (lVar30 = 0; lVar30 != 0x10; lVar30 = lVar30 + 2) {
            *(undefined2 *)(lVar27 + lVar30) = *puVar35;
            puVar35 = (undefined2 *)((long)puVar35 + (long)(int)local_a8._44_4_ * local_a8._16_8_);
          }
          puVar25 = (undefined2 *)((long)puVar25 + local_68 * local_a8._16_8_);
          lVar27 = lVar27 + 0x10;
        }
        puVar23 = puVar23 + (long)(int)local_a8._44_4_ * local_a8._16_8_ * 4;
      }
      lVar31 = lVar31 + 2;
    }
  }
  piVar18 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
        free((void *)local_a8._0_8_);
      }
      else {
        (*(*(_func_int ***)local_a8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx2(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(kernel, kernel_tm, inch, outch, opt);
}